

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboCases::StencilClearsTest::render
          (StencilClearsTest *this,Context *context,Surface *dst)

{
  TextureFormatInfo *__return_storage_ptr__;
  float outputType;
  TextureFormat TVar1;
  DataType type;
  deUint32 dVar2;
  deUint32 program;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  DataTypes *pDVar6;
  FboConfig *pFVar7;
  Vector<float,_3> local_4f0;
  Vector<float,_3> local_4e4;
  Vector<float,_3> local_4d8;
  Vector<float,_3> local_4cc;
  Vector<float,_3> local_4c0;
  Vector<float,_3> local_4b4;
  undefined1 local_4a8 [8];
  Framebuffer fbo;
  int height;
  int width;
  deUint32 quadsTex;
  deUint32 metaballsTex;
  deUint32 texFromFboShaderID;
  deUint32 texToFboShaderID;
  Vector<float,_4> local_448;
  DataTypes local_438;
  undefined1 local_420 [8];
  Texture2DShader texFromFboShader;
  Vector<float,_4> local_274;
  DataTypes local_258;
  undefined1 local_238 [8];
  Texture2DShader texToFboShader;
  Vec4 fboOutBias;
  Vec4 fboOutScale;
  TextureFormatInfo fboRangeInfo;
  DataType fboOutputType;
  TextureFormat TStack_28;
  DataType fboSamplerType;
  TextureFormat colorFormat;
  Surface *dst_local;
  Context *context_local;
  StencilClearsTest *this_local;
  
  colorFormat = (TextureFormat)dst;
  register0x00000000 = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  TStack_28 = register0x00000000;
  type = glu::getSampler2DType(register0x00000000);
  fboRangeInfo.lookupBias.m_data[2] =
       (float)FboTestUtil::getFragmentOutputType(&stack0xffffffffffffffd8);
  __return_storage_ptr__ = (TextureFormatInfo *)(fboOutScale.m_data + 2);
  tcu::getTextureFormatInfo(__return_storage_ptr__,&stack0xffffffffffffffd8);
  tcu::operator-((tcu *)(fboOutBias.m_data + 2),
                 (Vector<float,_4> *)(fboRangeInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)__return_storage_ptr__);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&texToFboShader.field_0x194,
             (Vector<float,_4> *)__return_storage_ptr__);
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_258);
  pDVar6 = FboTestUtil::DataTypes::operator<<(&local_258,TYPE_SAMPLER_2D);
  outputType = fboRangeInfo.lookupBias.m_data[2];
  tcu::Vector<float,_4>::Vector(&local_274,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texFromFboShader.field_0x194,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_238,pDVar6,(DataType)outputType,&local_274,
             (Vec4 *)&texFromFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_258);
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_438);
  pDVar6 = FboTestUtil::DataTypes::operator<<(&local_438,type);
  tcu::Vector<float,_4>::Vector(&local_448,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&texFromFboShaderID,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_420,pDVar6,TYPE_FLOAT_VEC4,&local_448,
             (Vec4 *)&texFromFboShaderID);
  FboTestUtil::DataTypes::~DataTypes(&local_438);
  dVar2 = (*context->_vptr_Context[0x75])(context,local_238);
  program = (*context->_vptr_Context[0x75])(context,local_420);
  fbo._52_4_ = 0x80;
  fbo.m_depthStencilBuffer = 0x80;
  FboTestUtil::Texture2DShader::setOutScaleBias
            ((Texture2DShader *)local_238,(Vec4 *)(fboOutBias.m_data + 2),
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::setTexScaleBias
            ((Texture2DShader *)local_420,0,(Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
             (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  createQuadsTex2D(context,2,0x1908,0x1401,fbo._52_4_,fbo.m_depthStencilBuffer);
  createMetaballsTex2D(context,1,0x1908,0x1401,fbo._52_4_,fbo.m_depthStencilBuffer);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_4a8,context,&(this->super_FboRenderCase).m_config,fbo._52_4_,
             fbo.m_depthStencilBuffer,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)local_4a8);
  dVar3 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_4a8);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar3);
  (*context->_vptr_Context[5])(context,0,0,(ulong)(uint)fbo._52_4_,(ulong)fbo.m_depthStencilBuffer);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xc11);
  (*context->_vptr_Context[0x32])(context,10,0x10,0x20,0x78);
  (*context->_vptr_Context[0x2c])(context,1);
  (*context->_vptr_Context[0x2d])(context,0x400);
  (*context->_vptr_Context[0x32])(context,0x10,0x20,100,0x40);
  (*context->_vptr_Context[0x2c])(context,2);
  (*context->_vptr_Context[0x2d])(context,0x400);
  (*context->_vptr_Context[0x34])(context,0xc11);
  (*context->_vptr_Context[0x33])(context,0xb90);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_238,context,dVar2);
  tcu::Vector<float,_3>::Vector(&local_4b4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_4c0,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar2,&local_4b4,&local_4c0);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x35])(context,0x202,2,0xff);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_238,context,dVar2);
  tcu::Vector<float,_3>::Vector(&local_4cc,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_4d8,1.0,1.0,0.0);
  sglr::drawQuad(context,dVar2,&local_4cc,&local_4d8);
  (*context->_vptr_Context[0x34])(context,0xb90);
  pFVar7 = Functional::Framebuffer::getConfig((Framebuffer *)local_4a8);
  if (pFVar7->colorType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    dVar2 = Functional::Framebuffer::getColorBuffer((Framebuffer *)local_4a8);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    uVar4 = (*context->_vptr_Context[2])();
    uVar5 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar4,(ulong)uVar5);
    FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_420,context,program);
    tcu::Vector<float,_3>::Vector(&local_4e4,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_4f0,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_4e4,&local_4f0);
    TVar1 = colorFormat;
    uVar4 = (*context->_vptr_Context[2])();
    uVar5 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,TVar1,0,0,(ulong)uVar4,(ulong)uVar5);
  }
  else {
    FboTestUtil::readPixels
              (context,(Surface *)colorFormat,0,0,fbo._52_4_,fbo.m_depthStencilBuffer,
               &stack0xffffffffffffffd8,(Vec4 *)(fboRangeInfo.valueMax.m_data + 2),
               (Vec4 *)(fboRangeInfo.lookupScale.m_data + 2));
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_4a8);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_420);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_238);
  return;
}

Assistant:

void StencilClearsTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);

	deUint32				texToFboShaderID	= context.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= context.createProgram(&texFromFboShader);

	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	int						width				= 128;
	int						height				= 128;

	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);

	createQuadsTex2D(context, quadsTex, GL_RGBA, GL_UNSIGNED_BYTE, width, height);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, width, height);

	Framebuffer fbo(context, m_config, width, height);
	fbo.checkCompleteness();

	// Bind framebuffer and clear
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Do stencil clears
	context.enable(GL_SCISSOR_TEST);
	context.scissor(10, 16, 32, 120);
	context.clearStencil(1);
	context.clear(GL_STENCIL_BUFFER_BIT);
	context.scissor(16, 32, 100, 64);
	context.clearStencil(2);
	context.clear(GL_STENCIL_BUFFER_BIT);
	context.disable(GL_SCISSOR_TEST);

	// Draw 2 textures with stecil tests
	context.enable(GL_STENCIL_TEST);

	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.stencilFunc(GL_EQUAL, 1, 0xffu);

	texToFboShader.setUniforms(context, texToFboShaderID);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.stencilFunc(GL_EQUAL, 2, 0xffu);

	texToFboShader.setUniforms(context, texToFboShaderID);
	sglr::drawQuad(context, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	context.disable(GL_STENCIL_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());

		texFromFboShader.setUniforms(context, texFromFboShaderID);
		sglr::drawQuad(context, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
}